

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

vector<hta::Row,_std::allocator<hta::Row>_> * __thiscall
hta::Metric::retrieve
          (vector<hta::Row,_std::allocator<hta::Row>_> *__return_storage_ptr__,Metric *this,
          TimePoint begin,TimePoint end,Duration interval_upper_limit,IntervalScope scope)

{
  TimePoint value;
  bool bVar1;
  add_pointer_t<std::vector<hta::Row>_> ptVar2;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *this_00;
  const_reference pvVar3;
  size_type __n;
  reference pTVar4;
  type active_time;
  Aggregate local_118;
  int local_e4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tStack_d8;
  TimeValue tv;
  __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
  local_c0;
  const_iterator __end1;
  const_iterator __begin1;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *__range1;
  TimePoint previous_timestamp;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *result_tv;
  add_pointer_t<std::vector<hta::Row>_> pro;
  undefined1 local_58 [8];
  variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
  flex;
  Metric *this_local;
  IntervalScope scope_local;
  Duration interval_upper_limit_local;
  TimePoint end_local;
  TimePoint begin_local;
  vector<hta::Row,_std::allocator<hta::Row>_> *result;
  
  flex.
  super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
  .super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
  super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
  super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
  super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
  super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._24_8_ = this;
  retrieve_flex((variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 *)local_58,this,begin,end,interval_upper_limit,scope,false);
  ptVar2 = std::
           get_if<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
                     ((variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                       *)local_58);
  if (ptVar2 == (add_pointer_t<std::vector<hta::Row>_>)0x0) {
    this_00 = std::
              get<std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>,std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
                        ((variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                          *)local_58);
    previous_timestamp.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
    ._3_1_ = 0;
    std::vector<hta::Row,_std::allocator<hta::Row>_>::vector(__return_storage_ptr__);
    bVar1 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::empty(this_00);
    if (!bVar1) {
      pvVar3 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::operator[](this_00,0);
      __range1 = (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)
                 (pvVar3->time).
                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 .__d.__r;
      __n = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::size(this_00);
      std::vector<hta::Row,_std::allocator<hta::Row>_>::reserve(__return_storage_ptr__,__n);
      __end1 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::begin(this_00);
      local_c0._M_current =
           (TimeValue *)std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_c0), bVar1) {
        pTVar4 = __gnu_cxx::
                 __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ::operator*(&__end1);
        tStack_d8.__d.__r =
             (duration)
             (pTVar4->time).
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
        tv.time.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               pTVar4->value;
        local_e4 = 0;
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000000000l>> *)&local_e0,&local_e4);
        value.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = tv.time.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
        active_time = std::chrono::operator-
                                (&tStack_d8,
                                 (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&__range1);
        Aggregate::Aggregate
                  (&local_118,
                   (Value)value.
                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          .__d.__r,(Duration)active_time.__r);
        std::vector<hta::Row,std::allocator<hta::Row>>::
        emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::Clock::time_point&,hta::Aggregate>
                  ((vector<hta::Row,std::allocator<hta::Row>> *)__return_storage_ptr__,&local_e0,
                   (time_point *)&tStack_d8,&local_118);
        __range1 = (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)tStack_d8.__d.__r;
        __gnu_cxx::
        __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
        ::operator++(&__end1);
      }
    }
    previous_timestamp.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
    ._3_1_ = 1;
  }
  else {
    std::vector<hta::Row,_std::allocator<hta::Row>_>::vector(__return_storage_ptr__,ptVar2);
  }
  std::
  variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
  ::~variant((variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
              *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Row> Metric::retrieve(TimePoint begin, TimePoint end, Duration interval_upper_limit,
                                  IntervalScope scope)
{
    auto flex = retrieve_flex(begin, end, interval_upper_limit, scope, false);
    if (auto pro = std::get_if<std::vector<Row>>(&flex))
    {
        // TODO check if that is correct
        // TODO check if that is actually efficient, i.e., zero-copy
        return std::move(*pro);
    }
    const auto& result_tv = std::get<std::vector<TimeValue>>(flex);
    std::vector<Row> result;
    if (result_tv.empty())
    {
        return result;
    }
    auto previous_timestamp = result_tv[0].time;
    result.reserve(result_tv.size());
    for (auto tv : result_tv)
    {
        result.emplace_back(Duration(0), tv.time,
                            Aggregate(tv.value, tv.time - previous_timestamp));
        previous_timestamp = tv.time;
    }
    return result;
}